

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void ZopfliResetHash(size_t window_size,ZopfliHash *h)

{
  size_t i;
  ZopfliHash *h_local;
  size_t window_size_local;
  
  h->val = 0;
  for (i = 0; i < 0x10000; i = i + 1) {
    h->head[i] = -1;
  }
  for (i = 0; i < window_size; i = i + 1) {
    h->prev[i] = (unsigned_short)i;
    h->hashval[i] = -1;
  }
  for (i = 0; i < window_size; i = i + 1) {
    h->same[i] = 0;
  }
  h->val2 = 0;
  for (i = 0; i < 0x10000; i = i + 1) {
    h->head2[i] = -1;
  }
  for (i = 0; i < window_size; i = i + 1) {
    h->prev2[i] = (unsigned_short)i;
    h->hashval2[i] = -1;
  }
  return;
}

Assistant:

void ZopfliResetHash(size_t window_size, ZopfliHash* h) {
  size_t i;

  h->val = 0;
  for (i = 0; i < 65536; i++) {
    h->head[i] = -1;  /* -1 indicates no head so far. */
  }
  for (i = 0; i < window_size; i++) {
    h->prev[i] = i;  /* If prev[j] == j, then prev[j] is uninitialized. */
    h->hashval[i] = -1;
  }

#ifdef ZOPFLI_HASH_SAME
  for (i = 0; i < window_size; i++) {
    h->same[i] = 0;
  }
#endif

#ifdef ZOPFLI_HASH_SAME_HASH
  h->val2 = 0;
  for (i = 0; i < 65536; i++) {
    h->head2[i] = -1;
  }
  for (i = 0; i < window_size; i++) {
    h->prev2[i] = i;
    h->hashval2[i] = -1;
  }
#endif
}